

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)6,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  StrWriter *this_00;
  char *pcVar5;
  char cVar6;
  Ea<(moira::Mode)6,_(moira::Size)2> dst;
  Ea<(moira::Mode)6,_(moira::Size)2> src;
  Ea<(moira::Mode)6,_(moira::Size)2> EStack_48;
  Ea<(moira::Mode)6,_(moira::Size)2> local_34;
  
  Op<(moira::Mode)6,(moira::Size)2>(&local_34,this,op & 7,addr);
  Op<(moira::Mode)6,(moira::Size)2>(&EStack_48,this,op >> 9 & 7,addr);
  bVar4 = str->upper;
  pcVar5 = "move";
  if ((bool)bVar4 != false) {
    pcVar5 = "MOVE";
  }
  cVar6 = *pcVar5;
  if (cVar6 != '\0') {
    do {
      pcVar5 = pcVar5 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar6;
      cVar6 = *pcVar5;
    } while (cVar6 != '\0');
    bVar4 = str->upper;
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x57;
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  this_00 = StrWriter::operator<<(str,&local_34);
  pcVar5 = this_00->ptr;
  this_00->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  pcVar5 = this_00->ptr;
  this_00->ptr = pcVar5 + 1;
  *pcVar5 = ' ';
  StrWriter::operator<<(this_00,&EStack_48);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}